

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

cmJSONHelper<std::string,_cmCMakePresetsGraph::ReadFileResult> *
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String
          (cmJSONHelper<std::string,_cmCMakePresetsGraph::ReadFileResult> *__return_storage_ptr__,
          ReadFileResult success,ReadFileResult fail,string *defval)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  pcVar1 = (defval->_M_dataplus)._M_p;
  local_38._0_4_ = success;
  local_38._4_4_ = fail;
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + defval->_M_string_length);
  std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,std::__cxx11::string_const&)::_lambda(std::__cxx11::string&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>
              *)__return_storage_ptr__,(anon_class_40_3_5a0d8fdd *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::string, E, CallState...> String(
    E success, E fail, const std::string& defval = "")
  {
    return [success, fail, defval](std::string& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isString()) {
        return fail;
      }
      out = value->asString();
      return success;
    };
  }